

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode hsts_out(stsentry *sts,FILE *fp)

{
  CURLcode CVar1;
  char *pcVar2;
  undefined1 local_60 [4];
  CURLcode result;
  tm stamp;
  FILE *fp_local;
  stsentry *sts_local;
  
  stamp.tm_zone = (char *)fp;
  if (sts->expires == 0x7fffffffffffffff) {
    pcVar2 = "";
    if ((sts->field_0x30 & 1) != 0) {
      pcVar2 = ".";
    }
    curl_mfprintf(fp,"%s%s \"%s\"\n",pcVar2,sts->host,"unlimited");
  }
  else {
    CVar1 = Curl_gmtime(sts->expires,(tm *)local_60);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    pcVar2 = "";
    if ((sts->field_0x30 & 1) != 0) {
      pcVar2 = ".";
    }
    curl_mfprintf((FILE *)stamp.tm_zone,"%s%s \"%d%02d%02d %02d:%02d:%02d\"\n",pcVar2,sts->host,
                  (ulong)(stamp.tm_mday + 0x76c),(ulong)(stamp.tm_hour + 1),stamp.tm_min,
                  stamp.tm_sec,result,local_60);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode hsts_out(struct stsentry *sts, FILE *fp)
{
  struct tm stamp;
  if(sts->expires != TIME_T_MAX) {
    CURLcode result = Curl_gmtime((time_t)sts->expires, &stamp);
    if(result)
      return result;
    fprintf(fp, "%s%s \"%d%02d%02d %02d:%02d:%02d\"\n",
            sts->includeSubDomains ? ".": "", sts->host,
            stamp.tm_year + 1900, stamp.tm_mon + 1, stamp.tm_mday,
            stamp.tm_hour, stamp.tm_min, stamp.tm_sec);
  }
  else
    fprintf(fp, "%s%s \"%s\"\n",
            sts->includeSubDomains ? ".": "", sts->host, UNLIMITED);
  return CURLE_OK;
}